

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestsetStringWithDataFieldWithoutDataLength::
TestsetStringWithDataFieldWithoutDataLength(TestsetStringWithDataFieldWithoutDataLength *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"setStringWithDataFieldWithoutDataLength","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x11c);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ddd0;
  return;
}

Assistant:

TEST(setStringWithDataFieldWithoutDataLength)
{
  FIX::Message object;
  DataDictionary dataDictionary("../spec/FIX42.xml");

  FIX::Headline headline("client");
  FIX42::News msg(headline);

  std::string s;
  char cc = -92;
  int data_len = rand() % 100;
  s.assign(data_len, cc);

  FIX::RawData data;
  data.setValue(s);

  msg.set(data);
  std::string str = msg.toString();

  CHECK_THROW(object.setString(str, true, &dataDictionary), InvalidMessage);
}